

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SchemaValidator.cpp
# Opt level: O0

void __thiscall xercesc_4_0::SchemaValidator::~SchemaValidator(SchemaValidator *this)

{
  XMemory *this_00;
  XMLBuffer *this_01;
  void *in_RSI;
  SchemaValidator *this_local;
  
  (this->super_XMLValidator)._vptr_XMLValidator = (_func_int **)&PTR__SchemaValidator_00536d00;
  if (this->fXsiType != (QName *)0x0) {
    (*(this->fXsiType->super_XSerializable)._vptr_XSerializable[1])();
  }
  this_00 = (XMemory *)this->fTypeStack;
  if (this_00 != (XMemory *)0x0) {
    ValueStackOf<xercesc_4_0::ComplexTypeInfo_*>::~ValueStackOf
              ((ValueStackOf<xercesc_4_0::ComplexTypeInfo_*> *)this_00);
    XMemory::operator_delete(this_00,in_RSI);
  }
  if ((this->fNotationBuf != (XMLBuffer *)0x0) &&
     (this_01 = this->fNotationBuf, this_01 != (XMLBuffer *)0x0)) {
    XMLBuffer::~XMLBuffer(this_01);
    XMemory::operator_delete((XMemory *)this_01,in_RSI);
  }
  XSDErrorReporter::~XSDErrorReporter(&this->fSchemaErrorReporter);
  XMLBuffer::~XMLBuffer(&this->fDatatypeBuffer);
  XMLValidator::~XMLValidator(&this->super_XMLValidator);
  return;
}

Assistant:

SchemaValidator::~SchemaValidator()
{
    delete fXsiType;
    delete fTypeStack;

    if (fNotationBuf)
        delete fNotationBuf;
}